

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O0

void __thiscall
ylt::metric::detail::summary_impl<unsigned_int,_6UL>::increase
          (summary_impl<unsigned_int,_6UL> *this,data_t *arr,uint16_t pos)

{
  int *piVar1;
  ushort in_DX;
  int lim;
  int delta;
  int lower;
  int upper;
  __int_type_conflict1 res;
  atomic<unsigned_int> *in_stack_ffffffffffffff10;
  data_t *in_stack_ffffffffffffff18;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  uint local_a8;
  ushort local_a2;
  uint local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  atomic<unsigned_int> *local_80;
  uint local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  atomic<unsigned_int> *local_68;
  uint local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  atomic<unsigned_int> *local_50;
  __int_type_conflict1 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  atomic<unsigned_int> *local_38;
  __int_type_conflict1 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  atomic<unsigned_int> *local_20;
  __int_type_conflict1 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  atomic<unsigned_int> *local_8;
  
  local_a2 = in_DX;
  local_50 = data_t::operator[](in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
  local_54 = 1;
  local_58 = 0;
  local_5c = 1;
  LOCK();
  local_a8 = (local_50->super___atomic_base<unsigned_int>)._M_i;
  (local_50->super___atomic_base<unsigned_int>)._M_i =
       (local_50->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  if (4290000000 < local_a8) {
    local_60 = local_a8;
    local_8 = data_t::operator[](in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
    local_c = 1;
    local_10 = 0;
    local_14 = 1;
    LOCK();
    local_18 = (local_8->super___atomic_base<unsigned_int>)._M_i;
    (local_8->super___atomic_base<unsigned_int>)._M_i =
         (local_8->super___atomic_base<unsigned_int>)._M_i - 1;
    UNLOCK();
    local_ac = 0x4000;
    if (local_a2 < 0x2000) {
      local_ac = 0x2000;
    }
    local_b0 = 0x2000;
    if (local_a2 < 0x2000) {
      local_b0 = 0;
    }
    local_b4 = 1;
    local_bc = local_ac - (uint)local_a2;
    local_c0 = ((uint)local_a2 - local_b0) + 1;
    piVar1 = std::max<int>(&local_bc,&local_c0);
    local_b8 = *piVar1;
    for (; local_b4 < local_b8; local_b4 = local_b4 + 1) {
      if ((int)((uint)local_a2 + local_b4) < local_ac) {
        in_stack_ffffffffffffff10 =
             data_t::operator[](in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
        local_6c = 1;
        local_70 = 0;
        local_74 = 1;
        in_stack_ffffffffffffff18 = (data_t *)0xffffffff;
        LOCK();
        local_78 = (in_stack_ffffffffffffff10->super___atomic_base<unsigned_int>)._M_i;
        (in_stack_ffffffffffffff10->super___atomic_base<unsigned_int>)._M_i =
             (in_stack_ffffffffffffff10->super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
        if (local_78 < 0xffb43481) {
          return;
        }
        local_68 = in_stack_ffffffffffffff10;
        local_20 = data_t::operator[]((data_t *)0xffffffff,(size_t)in_stack_ffffffffffffff10);
        local_24 = 1;
        local_28 = 0;
        local_2c = 1;
        LOCK();
        local_30 = (local_20->super___atomic_base<unsigned_int>)._M_i;
        (local_20->super___atomic_base<unsigned_int>)._M_i =
             (local_20->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
      }
      if (local_b0 <= (int)((uint)local_a2 - local_b4)) {
        local_80 = data_t::operator[](in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
        local_84 = 1;
        local_88 = 0;
        local_8c = 1;
        LOCK();
        local_90 = (local_80->super___atomic_base<unsigned_int>)._M_i;
        (local_80->super___atomic_base<unsigned_int>)._M_i =
             (local_80->super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
        if (local_90 < 0xffb43481) {
          return;
        }
        local_38 = data_t::operator[](in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
        local_3c = 1;
        local_40 = 0;
        local_44 = 1;
        LOCK();
        local_48 = (local_38->super___atomic_base<unsigned_int>)._M_i;
        (local_38->super___atomic_base<unsigned_int>)._M_i =
             (local_38->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
      }
    }
  }
  return;
}

Assistant:

void increase(data_t& arr, uint16_t pos) {
    auto res = arr[pos].fetch_add(1, std::memory_order::relaxed);
    if constexpr (std::is_same_v<uint_type, uint32_t>) {
      if (res > near_uint32_max) /*no overflow*/ [[likely]] {
        arr[pos].fetch_sub(1, std::memory_order::relaxed);
        int upper = (pos < bucket_size / 2) ? (bucket_size / 2) : (bucket_size);
        int lower = (pos < bucket_size / 2) ? (0) : (bucket_size / 2);
        for (int delta = 1, lim = (std::max)(upper - pos, pos - lower + 1);
             delta < lim; ++delta) {
          if (pos + delta < upper) {
            if (arr[pos + delta].fetch_add(1, std::memory_order::relaxed) <=
                near_uint32_max) {
              break;
            }
            arr[pos + delta].fetch_sub(1, std::memory_order::relaxed);
          }
          if (pos - delta >= lower) {
            if (arr[pos - delta].fetch_add(1, std::memory_order::relaxed) <=
                near_uint32_max) {
              break;
            }
            arr[pos - delta].fetch_sub(1, std::memory_order::relaxed);
          }
        }
      }
    }
  }